

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O1

Mode anon_unknown.dwarf_408b0::adios2_ToMode(adios2_mode mode,string *hint)

{
  invalid_argument *this;
  long *plVar1;
  long *plVar2;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (mode - adios2_mode_write < 6) {
    return *(Mode *)(&DAT_00129fc8 + (ulong)(mode - adios2_mode_write) * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"ERROR: invalid adios2_mode, ",hint);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::invalid_argument::invalid_argument(this,(string *)&local_60);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2::Mode adios2_ToMode(const adios2_mode mode, const std::string &hint)
{
    adios2::Mode modeCpp = adios2::Mode::Undefined;
    switch (mode)
    {
    case adios2_mode_write:
        modeCpp = adios2::Mode::Write;
        break;
    case adios2_mode_read:
        modeCpp = adios2::Mode::Read;
        break;
    case adios2_mode_append:
        modeCpp = adios2::Mode::Append;
        break;
    case adios2_mode_readRandomAccess:
        modeCpp = adios2::Mode::ReadRandomAccess;
        break;
    case adios2_mode_deferred:
        modeCpp = adios2::Mode::Deferred;
        break;
    case adios2_mode_sync:
        modeCpp = adios2::Mode::Sync;
        break;
    default:
        throw std::invalid_argument("ERROR: invalid adios2_mode, " + hint + "\n");
    }
    return modeCpp;
}